

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void anon_unknown.dwarf_d3af7e::ParseError(string *message,Element *element)

{
  Token *token;
  DeadlyImportError *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  Element *local_18;
  Element *element_local;
  string *message_local;
  
  local_18 = element;
  element_local = (Element *)message;
  if (element != (Element *)0x0) {
    token = Assimp::FBX::Element::KeyToken(element);
    ParseError(message,token);
  }
  this = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::operator+(&local_38,"FBX-Parser ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)element_local)
  ;
  DeadlyImportError::DeadlyImportError(this,&local_38);
  __cxa_throw(this,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

AI_WONT_RETURN void ParseError(const std::string& message, const Element* element)
    {
        if(element) {
            ParseError(message,element->KeyToken());
        }
        throw DeadlyImportError("FBX-Parser " + message);
    }